

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::Parse(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  byte bVar1;
  bool bVar2;
  long *in_RDX;
  ParserImpl *in_RDI;
  uint uVar3;
  ParserImpl parser;
  SingularOverwritePolicy overwrites_policy;
  uint local_1c8 [2];
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe7c;
  ParserImpl *in_stack_fffffffffffffeb0;
  Message *in_stack_fffffffffffffeb8;
  SingularOverwritePolicy in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Parser *in_stack_fffffffffffffec8;
  int in_stack_ffffffffffffff00;
  
  (**(code **)(*in_RDX + 0x38))();
  bVar1 = *(byte *)((long)&(in_RDI->tokenizer_error_collector_).super_ErrorCollector.
                           _vptr_ErrorCollector + 7);
  Message::GetDescriptor((Message *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  uVar3 = *(byte *)((long)&(in_RDI->tokenizer_error_collector_).super_ErrorCollector.
                           _vptr_ErrorCollector + 1) & 1;
  local_1c8[0] = (byte)~bVar1 & 1;
  ParserImpl::ParserImpl
            (in_RDI,(Descriptor *)local_1c8,
             (ZeroCopyInputStream *)
             CONCAT44(in_stack_fffffffffffffe7c,
                      *(undefined4 *)&(in_RDI->tokenizer_error_collector_).parser_),
             (ErrorCollector *)
             (CONCAT44(in_stack_fffffffffffffe74,
                       (uint)*(byte *)&(in_RDI->tokenizer_error_collector_).super_ErrorCollector.
                                       _vptr_ErrorCollector) & 0xffffffff00000001),
             (Finder *)
             (CONCAT44(in_stack_fffffffffffffe6c,
                       (uint)*(byte *)((long)&(in_RDI->tokenizer_error_collector_).
                                              super_ErrorCollector._vptr_ErrorCollector + 6)) &
             0xffffffff00000001),
             (ParseInfoTree *)
             (CONCAT44(in_stack_fffffffffffffe64,
                       (uint)*(byte *)((long)&(in_RDI->tokenizer_error_collector_).
                                              super_ErrorCollector._vptr_ErrorCollector + 5)) &
             0xffffffff00000001),in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffe5f,
             (bool)in_stack_fffffffffffffe5e,(bool)in_stack_fffffffffffffe5d,
             (bool)in_stack_fffffffffffffe5c,false,false,false,in_stack_ffffffffffffff00);
  bVar2 = MergeUsingImpl(in_stack_fffffffffffffec8,
                         (ZeroCopyInputStream *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  ParserImpl::~ParserImpl((ParserImpl *)CONCAT44(in_stack_fffffffffffffe44,uVar3));
  return bVar2;
}

Assistant:

bool TextFormat::Parser::Parse(io::ZeroCopyInputStream* input,
                               Message* output) {
  output->Clear();

  ParserImpl::SingularOverwritePolicy overwrites_policy =
      allow_singular_overwrites_ ? ParserImpl::ALLOW_SINGULAR_OVERWRITES
                                 : ParserImpl::FORBID_SINGULAR_OVERWRITES;

  ParserImpl parser(output->GetDescriptor(), input, error_collector_, finder_,
                    parse_info_tree_, overwrites_policy,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_extension_, allow_unknown_enum_,
                    allow_field_number_, allow_relaxed_whitespace_,
                    allow_partial_, recursion_limit_);
  return MergeUsingImpl(input, output, &parser);
}